

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void push_back(c2m_ctx_t c2m_ctx,VARR_token_t *tokens)

{
  long lVar1;
  pre_ctx *ppVar2;
  VARR_char_ptr_t *pVVar3;
  size_t sVar4;
  char_ptr_t *ppcVar5;
  stream_t psVar6;
  VARR_ifstate_t *pVVar7;
  int iVar8;
  c2m_ctx_t __ptr;
  FILE *f;
  MIR_error_func_t in_RCX;
  MIR_context_t __s1;
  MIR_context_t pMVar9;
  char *extraout_RDX;
  size_t sVar10;
  MIR_context_t t;
  MIR_context_t pMVar11;
  c2m_ctx_t c2m_ctx_00;
  c2m_ctx_t c2m_ctx_01;
  undefined8 in_R8;
  c2mir_options *pcVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  gen_ctx *pgVar16;
  bool bVar17;
  
  t = (MIR_context_t)tokens;
  c2m_ctx_00 = c2m_ctx;
  if (tokens != (VARR_token_t *)0x0) {
    uVar13 = (uint)tokens->els_num;
    if (0 < (int)uVar13) {
      uVar15 = (ulong)(uVar13 & 0x7fffffff);
      do {
        uVar14 = uVar15 - 1;
        if ((tokens->varr == (token_t *)0x0) || (tokens->els_num <= uVar14)) {
          push_back_cold_1();
          goto LAB_00192a88;
        }
        t = (MIR_context_t)tokens->varr[uVar14];
        c2m_ctx_00 = (c2m_ctx_t)c2m_ctx->buffered_tokens;
        unget_next_pptoken(c2m_ctx_00,(token_t)t);
        bVar17 = 1 < uVar15;
        uVar15 = uVar14;
      } while (bVar17);
    }
    return;
  }
LAB_00192a88:
  push_back_cold_2();
  if ((c2m_ctx_00 != (c2m_ctx_t)0x0) && (c2m_ctx_00->env[0].__jmpbuf[0] != 0)) {
    c2m_ctx_00->ctx = (MIR_context_t)0x0;
    return;
  }
  VARR_macro_call_ttrunc_cold_1();
  if ((c2m_ctx_00 == (c2m_ctx_t)0x0) || (c2m_ctx_00->env[0].__jmpbuf[0] == 0)) {
LAB_00192b6d:
    move_tokens_cold_5();
    __s1 = t;
    c2m_ctx_01 = c2m_ctx_00;
LAB_00192b72:
    move_tokens_cold_4();
  }
  else {
    c2m_ctx_00->ctx = (MIR_context_t)0x0;
    __s1 = t;
    c2m_ctx_01 = c2m_ctx_00;
    if (t == (MIR_context_t)0x0) goto LAB_00192b72;
    in_RCX = t->error_func;
    bVar17 = in_RCX == (MIR_error_func_t)0x0;
    if (t->gen_ctx != (gen_ctx *)0x0) {
      pgVar16 = (gen_ctx *)0x0;
      __s1 = (MIR_context_t)0x0;
      pMVar11 = t;
      do {
        if (bVar17) {
          move_tokens_cold_2();
LAB_00192b68:
          c2m_ctx_00 = c2m_ctx_01;
          t = pMVar11;
          move_tokens_cold_1();
          goto LAB_00192b6d;
        }
        __ptr = (c2m_ctx_t)c2m_ctx_00->env[0].__jmpbuf[0];
        if (__ptr == (c2m_ctx_t)0x0) goto LAB_00192b68;
        lVar1 = *(long *)(in_RCX + (long)pgVar16 * 8);
        pMVar11 = (MIR_context_t)((long)&__s1->gen_ctx + 1);
        pMVar9 = __s1;
        __s1 = pMVar11;
        if ((MIR_context_t)c2m_ctx_00->options < pMVar11) {
          pcVar12 = (c2mir_options *)((long)&pMVar11->gen_ctx + ((ulong)pMVar11 >> 1));
          c2m_ctx_01 = __ptr;
          __ptr = (c2m_ctx_t)realloc(__ptr,(long)pcVar12 * 8);
          c2m_ctx_00->env[0].__jmpbuf[0] = (long)__ptr;
          c2m_ctx_00->options = pcVar12;
          pMVar9 = c2m_ctx_00->ctx;
          __s1 = (MIR_context_t)((long)&pMVar9->gen_ctx + 1);
        }
        c2m_ctx_00->ctx = __s1;
        __ptr->env[0].__jmpbuf[(long)((long)&pMVar9[-1].wrapper_end_addr + 6)] = lVar1;
        pgVar16 = (gen_ctx *)((long)&pgVar16->ctx + 1);
        in_RCX = t->error_func;
        bVar17 = in_RCX == (MIR_error_func_t)0x0;
        pMVar11 = __s1;
      } while (pgVar16 < t->gen_ctx);
    }
    if (!bVar17) {
      t->gen_ctx = (gen_ctx *)0x0;
      return;
    }
  }
  move_tokens_cold_3();
  ppVar2 = c2m_ctx_01->pre_ctx;
  pVVar3 = ppVar2->once_include_files;
  if (pVVar3 == (VARR_char_ptr_t *)0x0) {
LAB_00192c68:
    add_include_stream_cold_3();
LAB_00192c6d:
    __assert_fail("fname != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                  ,0x89b,"void add_include_stream(c2m_ctx_t, const char *, const char *, pos_t)");
  }
  sVar4 = pVVar3->els_num;
  if (sVar4 != 0) {
    ppcVar5 = pVVar3->varr;
    sVar10 = 0;
    do {
      if (ppcVar5 == (char_ptr_t *)0x0) {
        add_include_stream_cold_1();
        goto LAB_00192c68;
      }
      iVar8 = strcmp((char *)__s1,ppcVar5[sVar10]);
      if (iVar8 == 0) {
        return;
      }
      sVar10 = sVar10 + 1;
    } while (sVar4 != sVar10);
  }
  if (__s1 == (MIR_context_t)0x0) goto LAB_00192c6d;
  if (extraout_RDX == (char *)0x0) {
    f = fopen((char *)__s1,"rb");
    if (f == (FILE *)0x0) goto LAB_00192c91;
    add_stream(c2m_ctx_01,(FILE *)f,(char *)__s1,(_func_int_c2m_ctx_t *)0x0);
  }
  else {
    add_stream(c2m_ctx_01,(FILE *)0x0,(char *)__s1,str_getc);
    psVar6 = c2m_ctx_01->cs;
    psVar6->curr = extraout_RDX;
    psVar6->start = extraout_RDX;
  }
  pVVar7 = ppVar2->ifs;
  if (pVVar7 != (VARR_ifstate_t *)0x0) {
    c2m_ctx_01->cs->ifs_length_at_stream_start = (int)pVVar7->els_num;
    return;
  }
  add_include_stream_cold_2();
LAB_00192c91:
  if (c2m_ctx_01->options->message_file != (FILE *)0x0) {
    error(c2m_ctx_01,0x1c18b5,(char *)in_RCX,in_R8,__s1);
  }
  longjmp((__jmp_buf_tag *)c2m_ctx_01->env,1);
}

Assistant:

static void push_back (c2m_ctx_t c2m_ctx, VARR (token_t) * tokens) {
#ifdef C2MIR_PREPRO_DEBUG
  pre_ctx_t pre_ctx = c2m_ctx->pre_ctx;
  fprintf (stderr,
           "# push back (macro call depth %d):", VARR_LENGTH (macro_call_t, macro_call_stack));
#endif
  for (int i = (int) VARR_LENGTH (token_t, tokens) - 1; i >= 0; i--) {
#ifdef C2MIR_PREPRO_DEBUG
    fprintf (stderr, " <%s>", get_token_str (VARR_GET (token_t, tokens, i)));
#endif
    unget_next_pptoken (c2m_ctx, VARR_GET (token_t, tokens, i));
  }
#ifdef C2MIR_PREPRO_DEBUG
  fprintf (stderr, "\n");
  print_output_buffer (c2m_ctx);
#endif
}